

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall CVmObjLookupTable::mod_entry(CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val)

{
  vm_lookup_val *pvVar1;
  undefined8 *in_RDX;
  vm_lookup_val **in_RDI;
  uint *unaff_retaddr;
  vm_lookup_val *entry;
  
  pvVar1 = find_entry((CVmObjLookupTable *)val,&entry->key,unaff_retaddr,in_RDI);
  if (pvVar1 != (vm_lookup_val *)0x0) {
    *(undefined8 *)&pvVar1->val = *in_RDX;
    (pvVar1->val).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1);
  }
  return;
}

Assistant:

void CVmObjLookupTable::mod_entry(VMG_ const vm_val_t *key,
                                  const vm_val_t *val)
{
    vm_lookup_val *entry;

    /* find the entry for the key */
    entry = find_entry(vmg_ key, 0, 0);

    /* if we found it, change the value to the given value */
    if (entry != 0)
        entry->val = *val;
}